

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Color * __thiscall
scene::World::final_color(Color *__return_storage_ptr__,World *this,Ray *ray,int recursion_depth)

{
  bool *__return_storage_ptr___00;
  bool bVar1;
  Intersection *intersect_00;
  Computation local_150;
  undefined1 local_60 [8];
  optional<const_core::Intersection> intersect;
  vector<core::Intersection,_std::allocator<core::Intersection>_> xs;
  int recursion_depth_local;
  Ray *ray_local;
  World *this_local;
  
  __return_storage_ptr___00 =
       &intersect.super__Optional_base<const_core::Intersection,_true,_true>._M_payload.
        super__Optional_payload_base<const_core::Intersection>._M_engaged;
  intersects((vector<core::Intersection,_std::allocator<core::Intersection>_> *)
             __return_storage_ptr___00,this,ray);
  core::hit((optional<const_core::Intersection> *)local_60,
            (vector<core::Intersection,_std::allocator<core::Intersection>_> *)
            __return_storage_ptr___00);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_60);
  if (bVar1) {
    intersect_00 = std::optional<const_core::Intersection>::value
                             ((optional<const_core::Intersection> *)local_60);
    core::Computation::Computation
              (&local_150,ray,intersect_00,
               (vector<core::Intersection,_std::allocator<core::Intersection>_> *)
               &intersect.super__Optional_base<const_core::Intersection,_true,_true>._M_payload.
                super__Optional_payload_base<const_core::Intersection>._M_engaged);
    shade(__return_storage_ptr__,this,&local_150,recursion_depth);
  }
  else {
    image::Color::Color(__return_storage_ptr__,0.0,0.0,0.0);
  }
  std::vector<core::Intersection,_std::allocator<core::Intersection>_>::~vector
            ((vector<core::Intersection,_std::allocator<core::Intersection>_> *)
             &intersect.super__Optional_base<const_core::Intersection,_true,_true>._M_payload.
              super__Optional_payload_base<const_core::Intersection>._M_engaged);
  return __return_storage_ptr__;
}

Assistant:

image::Color scene::World::final_color(const core::Ray &ray, int recursion_depth) const
{
    std::vector<core::Intersection> xs = intersects(ray);
    auto intersect = core::hit(xs);
    if (intersect)
	return shade(core::Computation{ray, intersect.value(), xs}, recursion_depth);
    else
	return image::Color{0, 0, 0};
}